

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_exception.hxx
# Opt level: O0

void __thiscall nuraft::rpc_exception::~rpc_exception(rpc_exception *this)

{
  rpc_exception *in_RDI;
  
  ~rpc_exception(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

rpc_exception(const std::string& err, ptr<req_msg> req)
        : req_(req), err_(err.c_str()) {}